

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xboxmatfx.cpp
# Opt level: O3

void * rw::xbox::matfxOpen(void *o,int32 param_2,int32 param_3)

{
  DAT_00149ce0 = ObjPipeline::create();
  DAT_00149ce0->instanceCB = defaultInstanceCB;
  DAT_00149ce0->uninstanceCB = defaultUninstanceCB;
  (DAT_00149ce0->super_ObjPipeline).super_Pipeline.pluginID = 0x120;
  (DAT_00149ce0->super_ObjPipeline).super_Pipeline.pluginData = 0;
  return o;
}

Assistant:

static void*
matfxOpen(void *o, int32, int32)
{
	matFXGlobals.pipelines[PLATFORM_XBOX] = makeMatFXPipeline();
	return o;
}